

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

u16 cellSizePtrNoPayload(MemPage *pPage,u8 *pCell)

{
  byte bVar1;
  u8 *puVar2;
  u8 *pEnd;
  u8 *pIter;
  u8 *pCell_local;
  MemPage *pPage_local;
  
  pEnd = pCell + 4;
  do {
    puVar2 = pEnd + 1;
    bVar1 = *pEnd;
    pEnd = puVar2;
  } while ((bVar1 & 0x80) != 0 && puVar2 < pCell + 0xd);
  return (short)puVar2 - (short)pCell;
}

Assistant:

static u16 cellSizePtrNoPayload(MemPage *pPage, u8 *pCell){
  u8 *pIter = pCell + 4; /* For looping over bytes of pCell */
  u8 *pEnd;              /* End mark for a varint */

#ifdef SQLITE_DEBUG
  /* The value returned by this function should always be the same as
  ** the (CellInfo.nSize) value found by doing a full parse of the
  ** cell. If SQLITE_DEBUG is defined, an assert() at the bottom of
  ** this function verifies that this invariant is not violated. */
  CellInfo debuginfo;
  pPage->xParseCell(pPage, pCell, &debuginfo);
#else
  UNUSED_PARAMETER(pPage);
#endif

  assert( pPage->childPtrSize==4 );
  pEnd = pIter + 9;
  while( (*pIter++)&0x80 && pIter<pEnd );
  assert( debuginfo.nSize==(u16)(pIter - pCell) || CORRUPT_DB );
  return (u16)(pIter - pCell);
}